

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

uint __thiscall FM::OPNA::GetReg(OPNA *this,uint addr)

{
  uint uVar1;
  uint data;
  uint addr_local;
  OPNA *this_local;
  
  if (addr < 0x10) {
    this_local._4_4_ = PSG::GetReg(&(this->super_OPNABase).super_OPNBase.psg,addr);
  }
  else if (addr == 0x108) {
    this_local._4_4_ = (this->super_OPNABase).adpcmreadbuf & 0xff;
    (this->super_OPNABase).adpcmreadbuf = (this->super_OPNABase).adpcmreadbuf >> 8;
    if (((this->super_OPNABase).control1 & 0x60) == 0x20) {
      uVar1 = OPNABase::ReadRAM(&this->super_OPNABase);
      (this->super_OPNABase).adpcmreadbuf = uVar1 << 8 | (this->super_OPNABase).adpcmreadbuf;
    }
  }
  else if (addr == 0xff) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint OPNA::GetReg(uint addr)
{
	if (addr < 0x10)
		return psg.GetReg(addr);

	if (addr == 0x108)
	{
//		LOG1("%d:reg[108] ->   ", Diag::GetCPUTick());

		uint data = adpcmreadbuf & 0xff;
		adpcmreadbuf >>= 8;
		if ((control1 & 0x60) == 0x20)
		{
			adpcmreadbuf |= ReadRAM() << 8;
//			LOG2("Rd [0x%.6x:%.2x] ", memaddr, adpcmreadbuf >> 8);
		}
//		LOG0("%.2x\n");
		return data;
	}

	if (addr == 0xff)
		return 1;

	return 0;
}